

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O1

_Bool effect_handler_SUMMON(effect_handler_context_t_conflict *context)

{
  short sVar1;
  int iVar2;
  loc grid;
  loc grid_00;
  loc grid_01;
  bool bVar3;
  player *ppVar4;
  wchar_t wVar5;
  wchar_t type;
  wchar_t wVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  int iVar9;
  wchar_t wVar10;
  uint32_t uVar11;
  monster *pmVar12;
  char *pcVar13;
  wchar_t wVar14;
  int iVar15;
  
  wVar5 = effect_calculate_value(context,false);
  wVar14 = context->subtype;
  iVar2 = context->other;
  type = summon_message_type(wVar14);
  wVar6 = summon_fallback_type(wVar14);
  sound(type);
  if (player->upkeep->arena_level == false) {
    if ((context->origin).what == SRC_MONSTER) {
      pmVar12 = cave_monster(cave,(context->origin).which.monster);
      if (pmVar12 == (monster *)0x0) {
        __assert_fail("mon",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/effect-handler-general.c"
                      ,0x8d3,"_Bool effect_handler_SUMMON(effect_handler_context_t *)");
      }
      wVar7 = summon_name_to_idx("KIN");
      if (wVar14 == wVar7) {
        kin_base = pmVar12->race->base;
      }
      wVar7 = pmVar12->race->level;
      iVar9 = 0;
      iVar15 = 0;
      if (L'\0' < wVar5 && 0 < player->depth * wVar7) {
        iVar15 = 0;
        iVar9 = 0;
        wVar10 = L'\x01';
        do {
          grid.x = (pmVar12->grid).x;
          grid.y = (pmVar12->grid).y;
          wVar8 = summon_specific(grid,wVar7 + iVar2,wVar14,false,false);
          iVar9 = wVar8 * wVar8 + iVar9;
          iVar15 = (iVar15 + 1) - (uint)(iVar9 == 0);
          if (player->depth * wVar7 <= iVar9) break;
          bVar3 = wVar10 < wVar5;
          wVar10 = wVar10 + L'\x01';
        } while (bVar3);
      }
      if ((L'\xffffffff' < wVar6 && iVar15 == 0) &&
         (iVar15 = 0, L'\0' < wVar5 && iVar9 < player->depth * wVar7)) {
        iVar15 = 0;
        wVar14 = L'\x01';
        do {
          grid_00.x = (pmVar12->grid).x;
          grid_00.y = (pmVar12->grid).y;
          wVar10 = summon_specific(grid_00,iVar2 + wVar7,wVar6,false,false);
          iVar9 = wVar10 * wVar10 + iVar9;
          iVar15 = (iVar15 + 1) - (uint)(iVar9 == 0);
          if (player->depth * wVar7 <= iVar9) break;
          bVar3 = wVar14 < wVar5;
          wVar14 = wVar14 + L'\x01';
        } while (bVar3);
      }
      if (iVar15 == 0) {
        msg("But nothing comes.");
      }
    }
    else {
      iVar15 = 0;
      ppVar4 = player;
      for (; player = ppVar4, wVar5 != L'\0'; wVar5 = wVar5 + L'\xffffffff') {
        sVar1 = ppVar4->depth;
        uVar11 = Rand_div(4);
        grid_01.x = (ppVar4->grid).x;
        grid_01.y = (ppVar4->grid).y;
        wVar6 = summon_specific(grid_01,sVar1 + iVar2,wVar14,true,uVar11 == 0);
        iVar15 = iVar15 + wVar6;
        ppVar4 = player;
      }
    }
    context->ident = true;
    if ((iVar15 != 0) && (player->timed[2] != 0)) {
      pcVar13 = "something";
      if (1 < iVar15) {
        pcVar13 = "many things";
      }
      msgt(type,"You hear %s appear nearby.",pcVar13);
    }
  }
  return true;
}

Assistant:

bool effect_handler_SUMMON(effect_handler_context_t *context)
{
	int summon_max = effect_calculate_value(context, false);
	int summon_type = context->subtype;
	int level_boost = context->other;
	int message_type = summon_message_type(summon_type);
	int fallback_type = summon_fallback_type(summon_type);
	int count = 0, val = 0, attempts = 0;

	sound(message_type);

	/* No summoning in arena levels */
	if (player->upkeep->arena_level) return true;

	/* Monster summon */
	if (context->origin.what == SRC_MONSTER) {
		struct monster *mon = cave_monster(cave, context->origin.which.monster);
		int rlev;

		assert(mon);

		/* Set the kin_base if necessary */
		if (summon_type == summon_name_to_idx("KIN")) {
			kin_base = mon->race->base;
		}

		/* Continue summoning until we reach the current dungeon level */
		rlev = mon->race->level;
		while ((val < player->depth * rlev) && (attempts < summon_max)) {
			int temp;

			/* Get a monster */
			temp = summon_specific(mon->grid, rlev + level_boost, summon_type,
								   false, false);

			val += temp * temp;

			/* Increase the attempt in case no monsters were available. */
			attempts++;

			/* Increase count of summoned monsters */
			if (val > 0)
				count++;
		}

		/* If the summon failed and there's a fallback type, use that */
		if ((count == 0) && (fallback_type >= 0)) {
			attempts = 0;
			while ((val < player->depth * rlev) && (attempts < summon_max)) {
				int temp;

				/* Get a monster */
				temp = summon_specific(mon->grid, rlev + level_boost,
									   fallback_type, false, false);

				val += temp * temp;

				/* Increase the attempt in case no monsters were available. */
				attempts++;

				/* Increase count of summoned monsters */
				if (val > 0)
					count++;
			}
		}

		/* Summoner failed */
		if (!count)
			msg("But nothing comes.");
	} else {
		/* If not a monster summon, it's simple */
		while (summon_max) {
			count += summon_specific(player->grid, player->depth + level_boost,
									 summon_type, true, one_in_(4));
			summon_max--;
		}
	}

	/* Identify */
	context->ident = true;

	/* Message for the blind */
	if (count && player->timed[TMD_BLIND])
		msgt(message_type, "You hear %s appear nearby.",
			 (count > 1 ? "many things" : "something"));

	return true;
}